

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer-from-check.c
# Opt level: O1

void check_cb(uv_check_t *handle)

{
  int iVar1;
  undefined8 *extraout_RDX;
  int64_t eval_b;
  int64_t eval_a;
  
  if (handle == &check_handle) {
    if (recv_cnt == 6) {
      check_cb_called = 1;
      iVar1 = uv_check_stop(&check_handle);
      if (iVar1 == 0) {
        uv_close((uv_handle_t *)&client,(uv_close_cb)0x0);
        uv_close((uv_handle_t *)&check_handle,(uv_close_cb)0x0);
        uv_close((uv_handle_t *)&server,(uv_close_cb)0x0);
        return;
      }
      goto LAB_001df6a0;
    }
  }
  else {
    check_cb_cold_1();
  }
  check_cb_cold_2();
LAB_001df6a0:
  check_cb_cold_3();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 10;
  return;
}

Assistant:

static void check_cb(uv_check_t* handle) {
  ASSERT_OK(uv_check_stop(&check_handle));
  ASSERT_OK(uv_timer_stop(&timer_handle));  /* Runs before timer_cb. */
  ASSERT_OK(uv_timer_start(&timer_handle, timer_cb, 50, 0));
  ASSERT_OK(uv_prepare_start(&prepare_handle, prepare_cb));
  ASSERT_OK(prepare_cb_called);
  ASSERT_OK(check_cb_called);
  ASSERT_OK(timer_cb_called);
  check_cb_called++;
}